

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O1

char p_b_coll_elem(parse *p,int endc)

{
  char *__s2;
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  cname *pcVar4;
  size_t __n;
  bool bVar5;
  
  __s2 = p->next;
  pcVar3 = p->end;
  bVar5 = __s2 < pcVar3;
  if (bVar5) {
    __n = 0;
    do {
      pcVar2 = __s2 + __n + 1;
      if (((pcVar2 < pcVar3) && (__s2[__n] == endc)) && (*pcVar2 == ']')) {
        if (bVar5) {
          pcVar3 = "NUL";
          pcVar4 = cnames;
          do {
            pcVar4 = pcVar4 + 1;
            iVar1 = strncmp(pcVar3,__s2,__n);
            if ((iVar1 == 0) && (pcVar3[__n] == '\0')) {
              return pcVar4[-1].code;
            }
            pcVar3 = pcVar4->name;
          } while (pcVar3 != (char *)0x0);
          if (__n == 1) {
            return *__s2;
          }
          if (p->error == 0) {
            p->error = 3;
          }
          goto LAB_001059e9;
        }
        break;
      }
      p->next = pcVar2;
      bVar5 = pcVar2 < pcVar3;
      __n = __n + 1;
    } while (pcVar2 != pcVar3);
  }
  if (p->error == 0) {
    p->error = 7;
  }
LAB_001059e9:
  p->next = nuls;
  p->end = nuls;
  return '\0';
}

Assistant:

static char			/* value of collating element */
p_b_coll_elem(p, endc)
struct parse *p;
int endc;			/* name ended by endc,']' */
{
	char *sp = p->next;
	struct cname *cp;
	size_t len;

	while (MORE() && !SEETWO(endc, ']'))
		NEXT();
	if (!MORE()) {
		seterr(p, REG_EBRACK);
		return(0);
	}
	len = (size_t)(p->next - sp);
	for (cp = cnames; cp->name != NULL; cp++)
		if (strncmp(cp->name, sp, len) == 0 && cp->name[len] == '\0')
			return(cp->code);	/* known name */
	if (len == 1)
		return(*sp);	/* single character */
	seterr(p, REG_ECOLLATE);			/* neither */
	return(0);
}